

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v8::detail::default_arg_formatter<wchar_t>::operator()
          (default_arg_formatter<wchar_t> *this,bool value)

{
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar1;
  locale_ref in_R8;
  locale_ref local_50;
  basic_format_specs<wchar_t> local_48;
  buffer<wchar_t> *local_28;
  undefined1 local_19;
  default_arg_formatter<wchar_t> *pdStack_18;
  bool value_local;
  default_arg_formatter<wchar_t> *this_local;
  
  local_28 = (this->out).container;
  local_19 = value;
  pdStack_18 = this;
  basic_format_specs<wchar_t>::basic_format_specs(&local_48);
  locale_ref::locale_ref(&local_50);
  bVar1.container._1_7_ = 0;
  bVar1.container._0_1_ = value;
  bVar1 = write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_bool,_0>
                    (local_28,bVar1,SUB81(&local_48,0),
                     (basic_format_specs<wchar_t> *)local_50.locale_,in_R8);
  return (iterator)bVar1.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }